

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

bool glcts::verifyResultImage<unsigned_int,1u,3u,3u>
               (GLuint n_mipmap_levels,GLuint n_layers,
               _func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *getComponents,GLubyte *data)

{
  bool bVar1;
  long lVar2;
  GLuint pixel;
  long lVar3;
  GLuint GVar4;
  GLuint face;
  int iVar5;
  uint components [1];
  vector<unsigned_int,_std::allocator<unsigned_int>_> expected_values;
  uint local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  uint *local_48;
  long local_40;
  _func_void_GLuint_GLint_GLint_GLint_GLint_uint_ptr *local_38;
  
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (uint *)data;
  local_38 = getComponents;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_68,(ulong)(n_layers * 0x36));
  if (n_layers != 0) {
    lVar2 = 0;
    GVar4 = 0;
    do {
      iVar5 = 0;
      local_40 = lVar2;
      do {
        lVar3 = 0;
        do {
          (*local_38)((GLuint)lVar3,iVar5,GVar4,n_layers,n_mipmap_levels,&local_6c);
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)lVar2 + (GLuint)lVar3] = local_6c;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 9);
        iVar5 = iVar5 + 1;
        lVar2 = lVar2 + 9;
      } while (iVar5 != 6);
      GVar4 = GVar4 + 1;
      lVar2 = local_40 + 0x36;
    } while (GVar4 != n_layers);
  }
  bVar1 = verifyImage<unsigned_int,1u,3u,3u>
                    (local_48,local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,n_layers);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool verifyResultImage(glw::GLuint n_mipmap_levels, glw::GLuint n_layers,
					   void (*getComponents)(glw::GLuint pixel_index, glw::GLint cube_face, glw::GLint layer_index,
											 glw::GLint n_layers, glw::GLint n_mipmap_levels, T* out_components),
					   const glw::GLubyte* data)
{
	const glw::GLuint n_components			= N_Components;
	const glw::GLuint face_width			= Width;
	const glw::GLuint face_height			= Height;
	const glw::GLuint n_pixels_per_face		= face_width * face_height;
	const glw::GLuint n_components_per_face = n_pixels_per_face * n_components;
	const glw::GLuint n_faces				= 6;
	const glw::GLuint n_total_faces			= n_layers * n_faces;
	const glw::GLuint n_total_components	= n_total_faces * n_components_per_face;
	const T*		  result_image			= (const T*)data;

	std::vector<T> expected_values;
	expected_values.resize(n_total_components);

	for (glw::GLuint layer = 0; layer < n_layers; ++layer)
	{
		const glw::GLuint layer_offset = layer * n_faces * n_components_per_face;

		for (glw::GLuint face = 0; face < n_faces; ++face)
		{
			const glw::GLuint face_offset = face * n_components_per_face + layer_offset;

			for (glw::GLuint pixel = 0; pixel < n_pixels_per_face; ++pixel)
			{
				const glw::GLuint pixel_offset = pixel * n_components + face_offset;

				T components[n_components];

				getComponents(pixel, face, layer, n_layers, n_mipmap_levels, components);

				for (glw::GLuint component = 0; component < n_components; ++component)
				{
					const glw::GLuint component_offset = pixel_offset + component;

					expected_values[component_offset] = components[component];
				}
			}
		}
	}

	return verifyImage<T, N_Components, Width, Height>(result_image, &expected_values[0], n_layers);
}